

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O2

void Dau_DsdTruth6Compose_rec(word Func,word (*pFanins) [64],word *pRes,int nVars,int nWordsR)

{
  int iVar;
  int iVar1;
  word wVar2;
  ulong uVar3;
  long lVar4;
  word awStack_438 [64];
  word local_238 [65];
  
  if (Func == 0xffffffffffffffff) {
    Abc_TtConst1(pRes,nWordsR);
    return;
  }
  if (Func == 0) {
    Abc_TtConst0(pRes,nWordsR);
    return;
  }
  uVar3 = (ulong)(nVars - 1);
  lVar4 = ~uVar3 << 9;
  while( true ) {
    iVar = (int)uVar3;
    if (iVar + 1 < 1) {
      __assert_fail("nVars > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauDsd.c"
                    ,0x1e1,"void Dau_DsdTruth6Compose_rec(word, word (*)[64], word *, int, int)");
    }
    if (iVar == 0) break;
    iVar1 = Abc_Tt6HasVar(Func,iVar);
    lVar4 = lVar4 + 0x200;
    uVar3 = (ulong)(iVar - 1);
    if (iVar1 != 0) {
      wVar2 = Abc_Tt6Cofactor0(Func,iVar);
      Dau_DsdTruth6Compose_rec(wVar2,pFanins,awStack_438,iVar,nWordsR);
      wVar2 = Abc_Tt6Cofactor1(Func,iVar);
      Dau_DsdTruth6Compose_rec(wVar2,pFanins,local_238,iVar,nWordsR);
      Abc_TtMux(pRes,(word *)((long)pFanins - lVar4),local_238,awStack_438,nWordsR);
      return;
    }
  }
  if ((Func != 0x5555555555555555) && (s_Truths6[0] != Func)) {
    __assert_fail("Func == s_Truths6[0] || Func == s_Truths6Neg[0]",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauDsd.c"
                  ,0x1e4,"void Dau_DsdTruth6Compose_rec(word, word (*)[64], word *, int, int)");
  }
  Abc_TtCopy(pRes,*pFanins,nWordsR,(uint)(Func == 0x5555555555555555));
  return;
}

Assistant:

void Dau_DsdTruth6Compose_rec( word Func, word pFanins[DAU_MAX_VAR][DAU_MAX_WORD], word * pRes, int nVars, int nWordsR )
{
    if ( Func == 0 )
    {
        Abc_TtConst0( pRes, nWordsR );
        return;
    }
    if ( Func == ~(word)0 )
    {
        Abc_TtConst1( pRes, nWordsR );
        return;
    }
    assert( nVars > 0 );
    if ( --nVars == 0 )
    {
        assert( Func == s_Truths6[0] || Func == s_Truths6Neg[0] );
        Abc_TtCopy( pRes, pFanins[0], nWordsR, Func == s_Truths6Neg[0] );
        return;
    }
    if ( !Abc_Tt6HasVar(Func, nVars) )
    {
        Dau_DsdTruth6Compose_rec( Func, pFanins, pRes, nVars, nWordsR );
        return;
    }
    {
        word pTtTemp[2][DAU_MAX_WORD];
        Dau_DsdTruth6Compose_rec( Abc_Tt6Cofactor0(Func, nVars), pFanins, pTtTemp[0], nVars, nWordsR );
        Dau_DsdTruth6Compose_rec( Abc_Tt6Cofactor1(Func, nVars), pFanins, pTtTemp[1], nVars, nWordsR );
        Abc_TtMux( pRes, pFanins[nVars], pTtTemp[1], pTtTemp[0], nWordsR );
        return;
    }
}